

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screena.cpp
# Opt level: O0

void robot_stat(int n)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int changed;
  int n_local;
  
  bVar1 = robots[n].last_damage != robots[n].damage;
  if (bVar1) {
    robots[n].last_damage = robots[n].damage;
    move(n * 5 + 2,col_1);
    printf("%03d",(ulong)(uint)robots[n].last_damage);
  }
  bVar2 = robots[n].last_scan != robots[n].scan;
  if (bVar2) {
    robots[n].last_scan = robots[n].scan;
    move(n * 5 + 2,col_2);
    printf("%03d",(ulong)(uint)robots[n].last_scan);
  }
  bVar3 = robots[n].last_speed != robots[n].speed;
  if (bVar3) {
    robots[n].last_speed = robots[n].speed;
    move(n * 5 + 3,col_1);
    printf("%03d",(ulong)(uint)robots[n].speed);
  }
  bVar4 = robots[n].last_heading != robots[n].heading;
  if (bVar4) {
    robots[n].last_heading = robots[n].heading;
    move(n * 5 + 3,col_2);
    printf("%03d",(ulong)(uint)robots[n].heading);
  }
  if (bVar4 || (bVar3 || (bVar2 || bVar1))) {
    refresh();
  }
  return;
}

Assistant:

void robot_stat(int n)
{
  int changed = 0;

  if (robots[n].last_damage != robots[n].damage) {
    robots[n].last_damage = robots[n].damage;
    move(5*n+2,col_1);
    printw("%03d",robots[n].last_damage);
    changed = 1;
  }
  if (robots[n].last_scan != robots[n].scan) {
    robots[n].last_scan = robots[n].scan;
    move(5*n+2,col_2);
    printw("%03d",robots[n].last_scan);
    changed = 1;
  }
  if (robots[n].last_speed != robots[n].speed) {
    robots[n].last_speed = robots[n].speed;
    move(5*n+3,col_1);
    printw("%03d",robots[n].speed);
    changed = 1;
  }
  if (robots[n].last_heading != robots[n].heading) {
    robots[n].last_heading = robots[n].heading;
    move(5*n+3,col_2);
    printw("%03d",robots[n].heading);
    changed = 1;
  }

/*
  move(5*n+4,col_1);
  printw("%3d",robots[n].x / CLICK);
  move(5*n+4,col_2);
  printw("%3d",robots[n].y / CLICK);
*/

  if (changed)
    refresh();
}